

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFraig(Abc_Ntk_t *pNtk,void *pParams,int fAllNodes,int fExdc)

{
  int iVar1;
  Fraig_Man_t *p;
  Abc_Ntk_t *pAVar2;
  Fraig_Man_t *pMan;
  Abc_Ntk_t *pNtkNew;
  Fraig_Params_t *pPars;
  int fExdc_local;
  int fAllNodes_local;
  void *pParams_local;
  Abc_Ntk_t *pNtk_local;
  
  pPars._0_4_ = fExdc;
  if ((fExdc != 0) && (pNtk->pExdc == (Abc_Ntk_t *)0x0)) {
    pPars._0_4_ = 0;
    printf("Warning: Networks has no EXDC.\n");
  }
  p = (Fraig_Man_t *)Abc_NtkToFraig(pNtk,pParams,fAllNodes,(int)pPars);
  if (*(int *)((long)pParams + 0x24) != 0) {
    Fraig_ManProveMiter(p);
  }
  if ((int)pPars == 0) {
    pMan = (Fraig_Man_t *)Abc_NtkFromFraig(p,pNtk);
  }
  else {
    pMan = (Fraig_Man_t *)Abc_NtkFromFraig2(p,pNtk);
  }
  Fraig_ManFree(p);
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    pAVar2 = Abc_NtkDup(pNtk->pExdc);
    *(Abc_Ntk_t **)&pMan->nSatSupps = pAVar2;
  }
  iVar1 = Abc_NtkCheck((Abc_Ntk_t *)pMan);
  if (iVar1 == 0) {
    printf("Abc_NtkFraig: The network check has failed.\n");
    Abc_NtkDelete((Abc_Ntk_t *)pMan);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pNtk_local = (Abc_Ntk_t *)pMan;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkFraig( Abc_Ntk_t * pNtk, void * pParams, int fAllNodes, int fExdc )
{
    Fraig_Params_t * pPars = (Fraig_Params_t *)pParams;
    Abc_Ntk_t * pNtkNew;
    Fraig_Man_t * pMan; 
    // check if EXDC is present
    if ( fExdc && pNtk->pExdc == NULL )
        fExdc = 0, printf( "Warning: Networks has no EXDC.\n" );
    // perform fraiging
    pMan = (Fraig_Man_t *)Abc_NtkToFraig( pNtk, pParams, fAllNodes, fExdc ); 
    // add algebraic choices
//    if ( pPars->fChoicing )
//        Fraig_ManAddChoices( pMan, 0, 6 );
    // prove the miter if asked to
    if ( pPars->fTryProve )
        Fraig_ManProveMiter( pMan );
    // reconstruct FRAIG in the new network
    if ( fExdc ) 
        pNtkNew = Abc_NtkFromFraig2( pMan, pNtk );
    else
        pNtkNew = Abc_NtkFromFraig( pMan, pNtk );
    Fraig_ManFree( pMan );
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkFraig: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}